

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O3

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)2>::decodeB
          (Predecoder<(InstructionSet::M68k::Model)2> *this,uint16_t instruction)

{
  uint uVar1;
  Preinstruction PVar2;
  uint uVar3;
  
  uVar3 = (uint)instruction;
  uVar1 = uVar3 & 0x1f8;
  if (uVar1 == 0x188) {
    return (Preinstruction)((uVar3 & 0xe00) * 0x80 + (uVar3 & 7) * 0x100 + 0x218182d);
  }
  if (uVar1 != 0x148) {
    if (uVar1 == 0x108) {
      return (Preinstruction)((uVar3 & 0xe00) * 0x80 + (uVar3 & 7) * 0x100 + 0x18182b);
    }
    switch(instruction >> 6 & 7) {
    case 0:
      PVar2 = decode<(unsigned_char)43,true>(this,instruction);
      return PVar2;
    case 1:
      PVar2 = decode<(unsigned_char)44,true>(this,instruction);
      return PVar2;
    case 2:
      PVar2 = decode<(unsigned_char)45,true>(this,instruction);
      return PVar2;
    case 3:
      PVar2 = decode<(unsigned_char)46,true>(this,instruction);
      return PVar2;
    case 4:
      PVar2 = decode<(unsigned_char)110,true>(this,instruction);
      return PVar2;
    case 5:
      PVar2 = decode<(unsigned_char)111,true>(this,instruction);
      return PVar2;
    case 6:
      PVar2 = decode<(unsigned_char)112,true>(this,instruction);
      return PVar2;
    case 7:
      PVar2 = decode<(unsigned_char)47,true>(this,instruction);
      return PVar2;
    }
  }
  return (Preinstruction)((uVar3 & 0xe00) * 0x80 + (uVar3 & 7) * 0x100 + 0x118182c);
}

Assistant:

Preinstruction Predecoder<model>::decodeB(uint16_t instruction) {
	using Op = Operation;

	switch(instruction & 0x1f8) {
		// 4-81 (p185)
		case 0x108:	Decode(CMPMb);
		case 0x148:	Decode(CMPMw);
		case 0x188:	Decode(CMPMl);

		default:	break;
	}

	switch(instruction & 0x1c0) {
		// 4-75 (p179)
		case 0x000:	Decode(Op::CMPb);
		case 0x040:	Decode(Op::CMPw);
		case 0x080:	Decode(Op::CMPl);

		// 4-77 (p181)
		case 0x0c0:	Decode(Op::CMPAw);
		case 0x1c0:	Decode(Op::CMPAl);

		// 4-100 (p204)
		case 0x100:	Decode(Op::EORb);
		case 0x140:	Decode(Op::EORw);
		case 0x180:	Decode(Op::EORl);

		default:	break;
	}

	return Preinstruction();
}